

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

long __thiscall
JsUtil::Stack<long,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
          (Stack<long,_Memory::HeapAllocator,_false,_DefaultComparer> *this)

{
  Type TVar1;
  int iVar2;
  Type *pTVar3;
  long item;
  Stack<long,_Memory::HeapAllocator,_false,_DefaultComparer> *this_local;
  
  iVar2 = ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer> *)this);
  pTVar3 = List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                     (&this->list,iVar2 + -1);
  TVar1 = *pTVar3;
  iVar2 = ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer> *)this);
  List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::RemoveAt
            (&this->list,iVar2 + -1);
  return TVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }